

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::SerializePartialToZeroCopyStream
          (MessageLite *this,ZeroCopyOutputStream *output)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *pLVar3;
  undefined4 extraout_var_00;
  EpsCopyOutputStream stream;
  LogFinisher local_79;
  string local_78;
  EpsCopyOutputStream local_58;
  
  iVar2 = (*this->_vptr_MessageLite[9])();
  if ((CONCAT44(extraout_var,iVar2) & 0xffffffff80000000) == 0) {
    local_58.is_serialization_deterministic_ =
         (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
    local_58.end_ = local_58.buffer_;
    local_58.had_error_ = false;
    local_58.aliasing_enabled_ = false;
    local_58.buffer_end_ = local_58.end_;
    local_58.stream_ = output;
    iVar2 = (*this->_vptr_MessageLite[0xc])(this,local_58.end_,&local_58);
    io::EpsCopyOutputStream::Trim(&local_58,(uint8 *)CONCAT44(extraout_var_00,iVar2));
    bVar1 = local_58.had_error_ ^ 1;
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_58,LOGLEVEL_DFATAL,
               "third_party/sentencepiece/third_party/protobuf-lite/message_lite.cc",0x19a);
    (*this->_vptr_MessageLite[2])(&local_78,this);
    pLVar3 = internal::LogMessage::operator<<((LogMessage *)&local_58,&local_78);
    pLVar3 = internal::LogMessage::operator<<(pLVar3," exceeded maximum protobuf size of 2GB: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,CONCAT44(extraout_var,iVar2));
    internal::LogFinisher::operator=(&local_79,pLVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    internal::LogMessage::~LogMessage((LogMessage *)&local_58);
    bVar1 = 0;
  }
  return (bool)bVar1;
}

Assistant:

bool MessageLite::SerializePartialToZeroCopyStream(
    io::ZeroCopyOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  uint8* target;
  io::EpsCopyOutputStream stream(
      output, io::CodedOutputStream::IsDefaultSerializationDeterministic(),
      &target);
  target = _InternalSerialize(target, &stream);
  stream.Trim(target);
  if (stream.HadError()) return false;
  return true;
}